

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O0

void __thiscall
duckdb::GroupedAggregateHashTable::AggregateHTAppendState::AggregateHTAppendState
          (AggregateHTAppendState *this,ArenaAllocator *allocator)

{
  Vector *this_00;
  LogicalType *type_p;
  idx_t capacity;
  long in_RDI;
  LogicalType *this_01;
  idx_t count;
  DataChunk *this_02;
  ArenaAllocator *allocator_00;
  idx_t in_stack_ffffffffffffff38;
  LogicalType *in_stack_ffffffffffffff40;
  idx_t in_stack_ffffffffffffff50;
  LogicalType *in_stack_ffffffffffffff58;
  PartitionedTupleDataAppendState *in_stack_ffffffffffffff80;
  
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState(in_stack_ffffffffffffff80);
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState(in_stack_ffffffffffffff80);
  this_00 = (Vector *)(in_RDI + 0x5b0);
  LogicalType::LogicalType
            (in_stack_ffffffffffffff40,(LogicalTypeId)(in_stack_ffffffffffffff38 >> 0x38));
  Vector::Vector(this_00,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  LogicalType::~LogicalType((LogicalType *)0x78bf63);
  type_p = (LogicalType *)(in_RDI + 0x618);
  LogicalType::LogicalType
            (in_stack_ffffffffffffff40,(LogicalTypeId)(in_stack_ffffffffffffff38 >> 0x38));
  Vector::Vector(this_00,type_p,in_stack_ffffffffffffff50);
  LogicalType::~LogicalType((LogicalType *)0x78bfad);
  capacity = in_RDI + 0x680;
  LogicalType::LogicalType
            (in_stack_ffffffffffffff40,(LogicalTypeId)(in_stack_ffffffffffffff38 >> 0x38));
  Vector::Vector(this_00,type_p,capacity);
  LogicalType::~LogicalType((LogicalType *)0x78bff7);
  SelectionVector::SelectionVector
            ((SelectionVector *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_01 = (LogicalType *)(in_RDI + 0x700);
  SelectionVector::SelectionVector((SelectionVector *)this_01,in_stack_ffffffffffffff38);
  count = in_RDI + 0x718;
  SelectionVector::SelectionVector((SelectionVector *)this_01,count);
  SelectionVector::SelectionVector((SelectionVector *)this_01,count);
  LogicalType::LogicalType(this_01,(LogicalTypeId)(count >> 0x38));
  Vector::Vector(this_00,type_p,capacity);
  LogicalType::~LogicalType((LogicalType *)0x78c0ac);
  this_02 = (DataChunk *)(in_RDI + 0x7b0);
  DataChunk::DataChunk(this_02);
  allocator_00 = (ArenaAllocator *)(in_RDI + 0x7f0);
  AggregateDictionaryState::AggregateDictionaryState
            ((AggregateDictionaryState *)in_stack_ffffffffffffff80);
  RowOperationsState::RowOperationsState((RowOperationsState *)this_02,allocator_00);
  return;
}

Assistant:

GroupedAggregateHashTable::AggregateHTAppendState::AggregateHTAppendState(ArenaAllocator &allocator)
    : hashes(LogicalType::HASH), ht_offsets(LogicalType::UBIGINT), hash_salts(LogicalType::HASH),
      group_compare_vector(STANDARD_VECTOR_SIZE), no_match_vector(STANDARD_VECTOR_SIZE),
      empty_vector(STANDARD_VECTOR_SIZE), new_groups(STANDARD_VECTOR_SIZE), addresses(LogicalType::POINTER),
      row_state(allocator) {
}